

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCStreamSize(int compressionLevel)

{
  size_t sVar1;
  int in_EDI;
  size_t newMB;
  size_t memBudget;
  int level;
  int in_stack_00000024;
  undefined8 local_10;
  undefined4 local_8;
  
  local_10 = 0;
  for (local_8 = 1; local_8 <= in_EDI; local_8 = local_8 + 1) {
    sVar1 = ZSTD_estimateCStreamSize_internal(in_stack_00000024);
    if (local_10 < sVar1) {
      local_10 = sVar1;
    }
  }
  return local_10;
}

Assistant:

size_t ZSTD_estimateCStreamSize(int compressionLevel) {
    int level;
    size_t memBudget = 0;
    for (level=1; level<=compressionLevel; level++) {
        size_t const newMB = ZSTD_estimateCStreamSize_internal(level);
        if (newMB > memBudget) memBudget = newMB;
    }
    return memBudget;
}